

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * Image_Function_Helper::RgbToBgr
                  (Image *__return_storage_ptr__,RgbToBgrForm4 rgbToBgr,Image *in)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x03','\x01');
  (*rgbToBgr)(in,0,0,__return_storage_ptr__,0,0,in->_width,in->_height);
  return __return_storage_ptr__;
}

Assistant:

Image RgbToBgr( FunctionTable::RgbToBgrForm4 rgbToBgr,
                    const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height(), RGB );

        rgbToBgr( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }